

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quat4f.cpp
# Opt level: O2

Quat4f __thiscall Quat4f::slerp(Quat4f *this,Quat4f *a,Quat4f *b,float t,bool allowFlip)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float fVar9;
  float fVar10;
  double dVar11;
  double dVar12;
  float fVar15;
  undefined4 in_XMM0_Db;
  undefined4 in_XMM0_Dc;
  undefined8 extraout_XMM0_Qb;
  undefined4 in_XMM0_Dd;
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar16 [16];
  Quat4f QVar17;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [56];
  
  auVar13._0_4_ = dot(a,b);
  auVar13._4_60_ = extraout_var;
  auVar7._8_4_ = 0x7fffffff;
  auVar7._0_8_ = 0x7fffffff7fffffff;
  auVar7._12_4_ = 0x7fffffff;
  auVar7 = vandps_avx512vl(auVar13._0_16_,auVar7);
  if (0.009999999776482582 <= 1.0 - (double)auVar7._0_4_) {
    dVar11 = acos((double)auVar7._0_4_);
    fVar9 = (float)dVar11;
    dVar11 = sin((double)fVar9);
    dVar12 = sin((double)((1.0 - t) * fVar9));
    auVar14._0_8_ = sin((double)(t * fVar9));
    auVar14._8_56_ = extraout_var_00;
    auVar1._8_8_ = extraout_XMM0_Qb;
    auVar1._0_8_ = dVar12;
    auVar7 = vunpcklpd_avx(auVar14._0_16_,auVar1);
    auVar8._8_8_ = (double)(float)dVar11;
    auVar8._0_8_ = (double)(float)dVar11;
    auVar7 = vdivpd_avx(auVar7,auVar8);
    auVar7 = vcvtpd2ps_avx(auVar7);
  }
  else {
    auVar5._4_4_ = in_XMM0_Db;
    auVar5._0_4_ = t;
    auVar5._8_4_ = in_XMM0_Dc;
    auVar5._12_4_ = in_XMM0_Dd;
    auVar7 = vinsertps_avx(auVar5,ZEXT416((uint)(1.0 - t)),0x10);
  }
  auVar1 = vmovshdup_avx(auVar7);
  auVar4._8_4_ = 0x80000000;
  auVar4._0_8_ = 0x8000000080000000;
  auVar4._12_4_ = 0x80000000;
  auVar8 = vxorps_avx512vl(auVar1,auVar4);
  uVar2 = vcmpss_avx512f(auVar13._0_16_,ZEXT816(0) << 0x40,1);
  bVar3 = (bool)((byte)uVar2 & 1);
  iVar6 = (uint)bVar3 * ((uint)allowFlip * auVar8._0_4_ + (uint)!allowFlip * auVar1._0_4_) +
          (uint)!bVar3 * auVar1._0_4_;
  fVar9 = auVar7._0_4_;
  fVar10 = fVar9 * b->m_elements[0];
  fVar15 = fVar9 * b->m_elements[1];
  auVar16._4_4_ = iVar6;
  auVar16._0_4_ = iVar6;
  auVar16._8_4_ = iVar6;
  auVar16._12_4_ = iVar6;
  auVar7 = vfmadd132ps_fma(auVar16,CONCAT412(fVar9 * b->m_elements[3],
                                             CONCAT48(fVar9 * b->m_elements[2],
                                                      CONCAT44(fVar15,fVar10))),
                           *(undefined1 (*) [16])a->m_elements);
  *(undefined1 (*) [16])this->m_elements = auVar7;
  QVar17.m_elements._8_8_ = auVar7._0_8_;
  QVar17.m_elements[0] = fVar10;
  QVar17.m_elements[1] = fVar15;
  return (Quat4f)QVar17.m_elements;
}

Assistant:

Quat4f Quat4f::slerp( const Quat4f& a, const Quat4f& b, float t, bool allowFlip )
{
	float cosAngle = Quat4f::dot( a, b );

	float c1;
	float c2;

	// Linear interpolation for close orientations
	if( ( 1.0f - fabs( cosAngle ) ) < 0.01f )
	{
		c1 = 1.0f - t;
		c2 = t;
	}
	else
	{
		// Spherical interpolation
		float angle = acos( fabs( cosAngle ) );
		float sinAngle = sin( angle );
		c1 = sin( angle * ( 1.0f - t ) ) / sinAngle;
		c2 = sin( angle * t ) / sinAngle;
	}

	// Use the shortest path
	if( allowFlip && ( cosAngle < 0.0f ) )
	{
		c1 = -c1;
	}

	return Quat4f( c1 * a[ 0 ] + c2 * b[ 0 ], c1 * a[ 1 ] + c2 * b[ 1 ], c1 * a[ 2 ] + c2 * b[ 2 ], c1 * a[ 3 ] + c2 * b[ 3 ] );
}